

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O3

void __thiscall
VideoHppGenerator::readTypeEnum
          (VideoHppGenerator *this,XMLElement *element,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *attributes)

{
  int line;
  int iVar1;
  _Base_ptr p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  pointer *ppcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Rb_tree_color _Var8;
  long lVar9;
  _Base_ptr *this_00;
  _Rb_tree_header *p_Var10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_bool>
  pVar11;
  string name;
  XMLElement *childElement;
  allocator_type local_1cc;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1cb;
  allocator_type local_1ca;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1c9;
  undefined1 local_1c8 [8];
  XMLElement **ppXStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [32];
  _Base_ptr local_158;
  size_t local_150;
  undefined1 local_148 [8];
  undefined1 auStack_140 [8];
  pointer local_138;
  _Base_ptr local_130;
  _Base_ptr local_128;
  _Base_ptr local_120;
  pointer local_118;
  int local_110;
  undefined1 local_108 [32];
  _Base_ptr local_e8;
  size_t local_e0;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  _Rb_tree_node_base local_a8;
  undefined1 local_88 [88];
  
  line = (element->super_XMLNode)._parseLineNum;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"enum","");
  __l._M_len = 1;
  __l._M_array = &local_198;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_1c8,__l,&local_1c9,&local_1ca);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[9],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_d8,(char (*) [9])"category",
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1c8);
  local_178._24_8_ = local_178 + 8;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = 0;
  local_178._16_8_ = (_Base_ptr)0x0;
  local_150 = 0;
  local_158 = (_Base_ptr)local_178._24_8_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[5],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_88,(char (*) [5])"name",
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_178);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_d8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)local_148,__l_00,&local_1cb,&local_1cc);
  local_108._24_8_ = local_108 + 8;
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = 0;
  local_108._16_8_ = (_Base_ptr)0x0;
  local_e0 = 0;
  local_e8 = (_Base_ptr)local_108._24_8_;
  checkAttributes(line,attributes,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_148,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_148);
  lVar9 = -0xa0;
  this_00 = (_Base_ptr *)(local_88 + 0x20);
  do {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
    if ((_Base_ptr)(this_00 + -2) != this_00[-4]) {
      operator_delete(this_00[-4],*(long *)(this_00 + -2) + 1);
    }
    this_00 = this_00 + -10;
    lVar9 = lVar9 + 0x50;
  } while (lVar9 != 0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_1c8 = (undefined1  [8])0x0;
  ppXStack_1c0 = (XMLElement **)0x0;
  local_1b8[0]._M_allocated_capacity = (_Base_ptr)0x0;
  local_d8._0_8_ = tinyxml2::XMLNode::FirstChildElement(&element->super_XMLNode,(char *)0x0);
  for (; (XMLElement *)local_d8._0_8_ != (XMLElement *)0x0;
      local_d8._0_8_ = tinyxml2::XMLNode::NextSiblingElement((XMLNode *)local_d8._0_8_,(char *)0x0))
  {
    if (ppXStack_1c0 == (XMLElement **)local_1b8[0]._0_8_) {
      std::vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>::
      _M_realloc_insert<tinyxml2::XMLElement_const*const&>
                ((vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>> *)
                 local_1c8,(iterator)ppXStack_1c0,(XMLElement **)local_d8);
    }
    else {
      *ppXStack_1c0 = (XMLElement *)local_d8._0_8_;
      ppXStack_1c0 = ppXStack_1c0 + 1;
    }
  }
  local_d8._24_8_ = local_d8 + 8;
  local_d8._16_8_ = 0;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_b8._8_8_ = 0;
  local_130 = (_Base_ptr)auStack_140;
  local_138 = (pointer)0x0;
  local_148 = (undefined1  [8])0x0;
  auStack_140 = (undefined1  [8])0x0;
  local_120 = (_Base_ptr)0x0;
  local_128 = local_130;
  local_b8._0_8_ = local_d8._24_8_;
  checkElements(line,(vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                      *)local_1c8,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_d8,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_148);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)local_d8);
  if (local_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity - (long)local_1c8);
  }
  local_1c8 = (undefined1  [8])local_1b8;
  ppXStack_1c0 = (pointer)0x0;
  local_1b8[0]._M_allocated_capacity = local_1b8[0]._M_allocated_capacity & 0xffffffffffffff00;
  p_Var2 = (attributes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(attributes->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var10) {
    do {
      iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var2 + 1),"name");
      if (iVar1 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 2)
                  );
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var10);
  }
  local_148._0_4_ = 4;
  auStack_140 = (undefined1  [8])0x0;
  local_138 = (pointer)0x0;
  local_130 = (_Base_ptr)0x0;
  local_118 = (pointer)0x0;
  local_128 = (_Rb_tree_node_base *)&local_138;
  local_120 = (_Rb_tree_node_base *)&local_138;
  local_110 = line;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,local_1c8,(pointer)((long)ppXStack_1c0 + (long)local_1c8));
  local_a8._M_left = &local_a8;
  local_b8._0_4_ = local_148._0_4_;
  if (local_130 == (_Base_ptr)0x0) {
    ppcVar6 = (pointer *)local_88;
    local_a8._M_parent = (_Base_ptr)0x0;
    _Var8 = _S_red;
    local_a8._M_right = local_a8._M_left;
  }
  else {
    ppcVar6 = &local_118;
    local_a8._M_parent = local_130;
    local_130->_M_parent = local_a8._M_left;
    local_88._0_8_ = local_118;
    local_130 = (_Base_ptr)0x0;
    local_a8._M_left = local_128;
    local_a8._M_right = local_120;
    _Var8 = (_Rb_tree_color)local_138;
    local_128 = (_Rb_tree_node_base *)&local_138;
    local_120 = (_Rb_tree_node_base *)&local_138;
  }
  *ppcVar6 = (pointer)0x0;
  local_88._8_4_ = local_110;
  local_a8._M_color = _Var8;
  pVar11 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
           ::_M_insert_unique<std::pair<std::__cxx11::string_const,TypeData>>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
                       *)&this->m_types,
                      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
                       *)local_d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 "enum <",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1c8);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108
                      ,"> already specified");
  local_178._0_8_ = (pbVar3->_M_dataplus)._M_p;
  paVar7 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._0_8_ == paVar7) {
    local_178._16_8_ = paVar7->_M_allocated_capacity;
    local_178._24_8_ = *(long *)((long)&pbVar3->field_2 + 8);
    local_178._0_8_ = local_178 + 0x10;
  }
  else {
    local_178._16_8_ = paVar7->_M_allocated_capacity;
  }
  local_178._8_8_ = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  checkForError((bool)(pVar11.second & 1),line,(string *)local_178);
  if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_b8 + 8));
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_140);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
          ::find(&(this->m_enums)._M_t,(key_type *)local_1c8);
  if ((_Rb_tree_header *)cVar4._M_node != &(this->m_enums)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("!m_enums.contains( name )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                  ,0x317,
                  "void VideoHppGenerator::readTypeEnum(const tinyxml2::XMLElement *, const std::map<std::string, std::string> &)"
                 );
  }
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_d8._16_8_ = 0;
  local_d8._24_4_ = line;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>_>_>
           ::operator[](&this->m_enums,(key_type *)local_1c8);
  local_138 = (pmVar5->values).
              super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_148 = (undefined1  [8])
              (pmVar5->values).
              super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
              ._M_impl.super__Vector_impl_data._M_start;
  auStack_140 = (undefined1  [8])
                (pmVar5->values).
                super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (pmVar5->values).
  super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pmVar5->values).
  super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pmVar5->values).
  super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_d8._16_8_ = 0;
  std::vector<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>::
  ~vector((vector<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
           *)local_148);
  pmVar5->xmlLine = local_d8._24_4_;
  std::vector<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>::
  ~vector((vector<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
           *)local_d8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,(ulong)(local_1b8[0]._M_allocated_capacity + 1));
  }
  return;
}

Assistant:

void VideoHppGenerator::readTypeEnum( tinyxml2::XMLElement const * element, std::map<std::string, std::string> const & attributes )
{
  int line = element->GetLineNum();
  checkAttributes( line, attributes, { { "category", { "enum" } }, { "name", {} } }, {} );
  checkElements( line, getChildElements( element ), {} );

  std::string name;
  for ( auto const & attribute : attributes )
  {
    if ( attribute.first == "name" )
    {
      name = attribute.second;
    }
  }

  checkForError( m_types.insert( { name, TypeData{ TypeCategory::Enum, {}, line } } ).second, line, "enum <" + name + "> already specified" );
  assert( !m_enums.contains( name ) );
  m_enums[name] = EnumData{ .xmlLine = line };
}